

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_writeout.c
# Opt level: O1

void ourWriteOut(CURL *curl,OutStruct *outs,char *writeinfo)

{
  char cVar1;
  char cVar2;
  byte bVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  char *pcVar7;
  undefined8 *puVar8;
  char *pcVar9;
  undefined8 uVar10;
  char *pcVar11;
  int __c;
  FILE *__stream;
  variable *pvVar12;
  long lVar13;
  bool bVar14;
  double doubleinfo;
  long longinfo;
  char *stringp;
  undefined8 local_50;
  char *local_48;
  char local_39;
  char *local_38;
  
  local_38 = (char *)0x0;
  __stream = _stdout;
  if (writeinfo == (char *)0x0) {
    return;
  }
LAB_0011bfa2:
  do {
    while (cVar1 = *writeinfo, cVar1 != '%') {
      if (cVar1 == '\\') {
        bVar3 = writeinfo[1];
        if (bVar3 < 0x72) {
          if (bVar3 == 0) goto LAB_0011bfb8;
          if (bVar3 != 0x6e) {
LAB_0011c034:
            iVar6 = 0x5c;
            goto LAB_0011c039;
          }
          __c = 10;
        }
        else if (bVar3 == 0x72) {
          __c = 0xd;
        }
        else {
          if (bVar3 != 0x74) goto LAB_0011c034;
          __c = 9;
        }
LAB_0011c04d:
        fputc(__c,__stream);
        writeinfo = writeinfo + 2;
      }
      else {
        if (cVar1 == '\0') {
          return;
        }
LAB_0011bfb8:
        fputc((int)cVar1,__stream);
        writeinfo = writeinfo + 1;
      }
    }
    cVar2 = writeinfo[1];
    if (cVar2 == '\0') goto LAB_0011bfb8;
    if (cVar2 != '{') {
      __c = 0x25;
      iVar6 = 0x25;
      if (cVar2 == '%') goto LAB_0011c04d;
LAB_0011c039:
      fputc(iVar6,__stream);
      __c = (int)writeinfo[1];
      goto LAB_0011c04d;
    }
    pcVar7 = strchr(writeinfo,0x7d);
    writeinfo = writeinfo + 2;
    if (pcVar7 == (char *)0x0) {
      fputs("%{",__stream);
      goto LAB_0011bfa2;
    }
    local_39 = *pcVar7;
    *pcVar7 = '\0';
    iVar6 = curl_strequal(writeinfo,"url_effective");
    if (iVar6 == 0) {
      lVar5 = 0;
      do {
        lVar13 = lVar5;
        lVar4 = *(long *)((long)&replacements[1].name + lVar13);
        if (lVar13 + 0x10 == 0x210) {
          bVar14 = lVar4 == 0;
          goto switchD_0011c0e7_default;
        }
        iVar6 = curl_strequal(writeinfo,lVar4);
        lVar5 = lVar13 + 0x10;
      } while (iVar6 == 0);
      bVar14 = lVar4 == 0;
      pvVar12 = (variable *)(lVar13 + 0x12ab50);
    }
    else {
      bVar14 = false;
      pvVar12 = replacements;
    }
    switch(pvVar12->id) {
    case VAR_TOTAL_TIME:
      uVar10 = 0x300003;
      goto LAB_0011c285;
    case VAR_NAMELOOKUP_TIME:
      uVar10 = 0x300004;
      goto LAB_0011c285;
    case VAR_CONNECT_TIME:
      uVar10 = 0x300005;
      goto LAB_0011c285;
    case VAR_APPCONNECT_TIME:
      uVar10 = 0x300021;
      goto LAB_0011c285;
    case VAR_PRETRANSFER_TIME:
      uVar10 = 0x300006;
      goto LAB_0011c285;
    case VAR_STARTTRANSFER_TIME:
      uVar10 = 0x300011;
      goto LAB_0011c285;
    case VAR_SIZE_DOWNLOAD:
      uVar10 = 0x300008;
      goto LAB_0011c2e3;
    case VAR_SIZE_UPLOAD:
      uVar10 = 0x300007;
LAB_0011c2e3:
      iVar6 = curl_easy_getinfo(curl,uVar10,&local_50);
      if (iVar6 != 0) goto switchD_0011c0e7_default;
      pcVar9 = "%.0f";
      goto LAB_0011c375;
    case VAR_SPEED_DOWNLOAD:
      uVar10 = 0x300009;
      goto LAB_0011c359;
    case VAR_SPEED_UPLOAD:
      uVar10 = 0x30000a;
LAB_0011c359:
      iVar6 = curl_easy_getinfo(curl,uVar10,&local_50);
      if (iVar6 != 0) goto switchD_0011c0e7_default;
      pcVar9 = "%.3f";
      goto LAB_0011c375;
    case VAR_HTTP_CODE:
      uVar10 = 0x200002;
      goto LAB_0011c328;
    case VAR_HTTP_CODE_PROXY:
      uVar10 = 0x200016;
LAB_0011c328:
      iVar6 = curl_easy_getinfo(curl,uVar10,&local_48);
      if (iVar6 != 0) goto switchD_0011c0e7_default;
      pcVar11 = "%03ld";
      pcVar9 = local_48;
      goto LAB_0011c491;
    case VAR_HEADER_SIZE:
      uVar10 = 0x20000b;
      break;
    case VAR_REQUEST_SIZE:
      uVar10 = 0x20000c;
      break;
    case VAR_EFFECTIVE_URL:
      uVar10 = 0x100001;
      goto LAB_0011c3d5;
    case VAR_CONTENT_TYPE:
      uVar10 = 0x100012;
      goto LAB_0011c3d5;
    case VAR_NUM_CONNECTS:
      uVar10 = 0x20001a;
      break;
    case VAR_REDIRECT_TIME:
      uVar10 = 0x300013;
LAB_0011c285:
      iVar6 = curl_easy_getinfo(curl,uVar10,&local_50);
      if (iVar6 == 0) {
        pcVar9 = "%.6f";
LAB_0011c375:
        curl_mfprintf(local_50,__stream,pcVar9);
      }
      goto switchD_0011c0e7_default;
    case VAR_REDIRECT_COUNT:
      uVar10 = 0x200014;
      break;
    case VAR_FTP_ENTRY_PATH:
      uVar10 = 0x10001e;
      goto LAB_0011c3d5;
    case VAR_REDIRECT_URL:
      uVar10 = 0x10001f;
LAB_0011c3d5:
      iVar6 = curl_easy_getinfo(curl,uVar10,&local_38);
      if (local_38 != (char *)0x0 && iVar6 == 0) {
        fputs(local_38,__stream);
      }
      goto switchD_0011c0e7_default;
    case VAR_SSL_VERIFY_RESULT:
      uVar10 = 0x20000d;
      break;
    case VAR_PROXY_SSL_VERIFY_RESULT:
      uVar10 = 0x20002f;
      break;
    case VAR_EFFECTIVE_FILENAME:
      pcVar9 = outs->filename;
      if (outs->filename == (char *)0x0) goto switchD_0011c0e7_default;
      goto LAB_0011c48a;
    case VAR_PRIMARY_IP:
      uVar10 = 0x100020;
      goto LAB_0011c47a;
    case VAR_PRIMARY_PORT:
      uVar10 = 0x200028;
      break;
    case VAR_LOCAL_IP:
      uVar10 = 0x100029;
      goto LAB_0011c47a;
    case VAR_LOCAL_PORT:
      uVar10 = 0x20002a;
      break;
    case VAR_HTTP_VERSION:
      iVar6 = curl_easy_getinfo(curl,0x20002e,&local_48);
      if (iVar6 == 0) {
        if (local_48 + -1 < (char *)0x3) {
          pcVar9 = &DAT_00124334 + *(int *)(&DAT_00124334 + (long)(local_48 + -1) * 4);
        }
        else {
          pcVar9 = "0";
        }
        curl_mfprintf(__stream,pcVar9);
      }
      goto switchD_0011c0e7_default;
    case VAR_SCHEME:
      uVar10 = 0x100031;
LAB_0011c47a:
      iVar6 = curl_easy_getinfo(curl,uVar10,&local_38);
      pcVar9 = local_38;
      if (iVar6 != 0) goto switchD_0011c0e7_default;
LAB_0011c48a:
      pcVar11 = "%s";
      goto LAB_0011c491;
    case VAR_STDOUT:
      puVar8 = (undefined8 *)&stdout;
      goto LAB_0011c38b;
    case VAR_STDERR:
      puVar8 = (undefined8 *)&stderr;
LAB_0011c38b:
      __stream = (FILE *)*puVar8;
    default:
      goto switchD_0011c0e7_default;
    }
    iVar6 = curl_easy_getinfo(curl,uVar10,&local_48);
    if (iVar6 == 0) {
      pcVar11 = "%ld";
      pcVar9 = local_48;
LAB_0011c491:
      curl_mfprintf(__stream,pcVar11,pcVar9);
    }
switchD_0011c0e7_default:
    if (bVar14) {
      curl_mfprintf(_stderr,"curl: unknown --write-out variable: \'%s\'\n",writeinfo);
    }
    writeinfo = pcVar7 + 1;
    *pcVar7 = local_39;
  } while( true );
}

Assistant:

void ourWriteOut(CURL *curl, struct OutStruct *outs, const char *writeinfo)
{
  FILE *stream = stdout;
  const char *ptr = writeinfo;
  char *stringp = NULL;
  long longinfo;
  double doubleinfo;

  while(ptr && *ptr) {
    if('%' == *ptr && ptr[1]) {
      if('%' == ptr[1]) {
        /* an escaped %-letter */
        fputc('%', stream);
        ptr += 2;
      }
      else {
        /* this is meant as a variable to output */
        char *end;
        if('{' == ptr[1]) {
          char keepit;
          int i;
          bool match = FALSE;
          end = strchr(ptr, '}');
          ptr += 2; /* pass the % and the { */
          if(!end) {
            fputs("%{", stream);
            continue;
          }
          keepit = *end;
          *end = 0; /* zero terminate */
          for(i = 0; replacements[i].name; i++) {
            if(curl_strequal(ptr, replacements[i].name)) {
              match = TRUE;
              switch(replacements[i].id) {
              case VAR_EFFECTIVE_URL:
                if((CURLE_OK ==
                    curl_easy_getinfo(curl, CURLINFO_EFFECTIVE_URL, &stringp))
                   && stringp)
                  fputs(stringp, stream);
                break;
              case VAR_HTTP_CODE:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_RESPONSE_CODE, &longinfo))
                  fprintf(stream, "%03ld", longinfo);
                break;
              case VAR_HTTP_CODE_PROXY:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_HTTP_CONNECTCODE,
                                     &longinfo))
                  fprintf(stream, "%03ld", longinfo);
                break;
              case VAR_HEADER_SIZE:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_HEADER_SIZE, &longinfo))
                  fprintf(stream, "%ld", longinfo);
                break;
              case VAR_REQUEST_SIZE:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_REQUEST_SIZE, &longinfo))
                  fprintf(stream, "%ld", longinfo);
                break;
              case VAR_NUM_CONNECTS:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_NUM_CONNECTS, &longinfo))
                  fprintf(stream, "%ld", longinfo);
                break;
              case VAR_REDIRECT_COUNT:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_REDIRECT_COUNT, &longinfo))
                  fprintf(stream, "%ld", longinfo);
                break;
              case VAR_REDIRECT_TIME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_REDIRECT_TIME,
                                     &doubleinfo))
                  fprintf(stream, "%.6f", doubleinfo);
                break;
              case VAR_TOTAL_TIME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_TOTAL_TIME, &doubleinfo))
                  fprintf(stream, "%.6f", doubleinfo);
                break;
              case VAR_NAMELOOKUP_TIME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_NAMELOOKUP_TIME,
                                     &doubleinfo))
                  fprintf(stream, "%.6f", doubleinfo);
                break;
              case VAR_CONNECT_TIME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_CONNECT_TIME, &doubleinfo))
                  fprintf(stream, "%.6f", doubleinfo);
                break;
              case VAR_APPCONNECT_TIME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_APPCONNECT_TIME,
                                     &doubleinfo))
                  fprintf(stream, "%.6f", doubleinfo);
                break;
              case VAR_PRETRANSFER_TIME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_PRETRANSFER_TIME,
                                     &doubleinfo))
                  fprintf(stream, "%.6f", doubleinfo);
                break;
              case VAR_STARTTRANSFER_TIME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_STARTTRANSFER_TIME,
                                     &doubleinfo))
                  fprintf(stream, "%.6f", doubleinfo);
                break;
              case VAR_SIZE_UPLOAD:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_SIZE_UPLOAD, &doubleinfo))
                  fprintf(stream, "%.0f", doubleinfo);
                break;
              case VAR_SIZE_DOWNLOAD:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_SIZE_DOWNLOAD,
                                     &doubleinfo))
                  fprintf(stream, "%.0f", doubleinfo);
                break;
              case VAR_SPEED_DOWNLOAD:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_SPEED_DOWNLOAD,
                                     &doubleinfo))
                  fprintf(stream, "%.3f", doubleinfo);
                break;
              case VAR_SPEED_UPLOAD:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_SPEED_UPLOAD, &doubleinfo))
                  fprintf(stream, "%.3f", doubleinfo);
                break;
              case VAR_CONTENT_TYPE:
                if((CURLE_OK ==
                    curl_easy_getinfo(curl, CURLINFO_CONTENT_TYPE, &stringp))
                   && stringp)
                  fputs(stringp, stream);
                break;
              case VAR_FTP_ENTRY_PATH:
                if((CURLE_OK ==
                    curl_easy_getinfo(curl, CURLINFO_FTP_ENTRY_PATH, &stringp))
                   && stringp)
                  fputs(stringp, stream);
                break;
              case VAR_REDIRECT_URL:
                if((CURLE_OK ==
                    curl_easy_getinfo(curl, CURLINFO_REDIRECT_URL, &stringp))
                   && stringp)
                  fputs(stringp, stream);
                break;
              case VAR_SSL_VERIFY_RESULT:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_SSL_VERIFYRESULT,
                                     &longinfo))
                  fprintf(stream, "%ld", longinfo);
                break;
              case VAR_PROXY_SSL_VERIFY_RESULT:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_PROXY_SSL_VERIFYRESULT,
                                     &longinfo))
                  fprintf(stream, "%ld", longinfo);
                break;
              case VAR_EFFECTIVE_FILENAME:
                if(outs->filename)
                  fprintf(stream, "%s", outs->filename);
                break;
              case VAR_PRIMARY_IP:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_PRIMARY_IP,
                                     &stringp))
                  fprintf(stream, "%s", stringp);
                break;
              case VAR_PRIMARY_PORT:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_PRIMARY_PORT,
                                     &longinfo))
                  fprintf(stream, "%ld", longinfo);
                break;
              case VAR_LOCAL_IP:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_LOCAL_IP,
                                     &stringp))
                  fprintf(stream, "%s", stringp);
                break;
              case VAR_LOCAL_PORT:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_LOCAL_PORT,
                                     &longinfo))
                  fprintf(stream, "%ld", longinfo);
                break;
              case VAR_HTTP_VERSION:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_HTTP_VERSION,
                                     &longinfo)) {
                  const char *version = "0";
                  switch(longinfo) {
                  case CURL_HTTP_VERSION_1_0:
                    version = "1.0";
                    break;
                  case CURL_HTTP_VERSION_1_1:
                    version = "1.1";
                    break;
                  case CURL_HTTP_VERSION_2_0:
                    version = "2";
                    break;
                  }

                  fprintf(stream, version);
                }
                break;
              case VAR_SCHEME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_SCHEME,
                                     &stringp))
                  fprintf(stream, "%s", stringp);
                break;
              case VAR_STDOUT:
                stream = stdout;
                break;
              case VAR_STDERR:
                stream = stderr;
                break;
              default:
                break;
              }
              break;
            }
          }
          if(!match) {
            fprintf(stderr, "curl: unknown --write-out variable: '%s'\n", ptr);
          }
          ptr = end + 1; /* pass the end */
          *end = keepit;
        }
        else {
          /* illegal syntax, then just output the characters that are used */
          fputc('%', stream);
          fputc(ptr[1], stream);
          ptr += 2;
        }
      }
    }
    else if('\\' == *ptr && ptr[1]) {
      switch(ptr[1]) {
      case 'r':
        fputc('\r', stream);
        break;
      case 'n':
        fputc('\n', stream);
        break;
      case 't':
        fputc('\t', stream);
        break;
      default:
        /* unknown, just output this */
        fputc(*ptr, stream);
        fputc(ptr[1], stream);
        break;
      }
      ptr += 2;
    }
    else {
      fputc(*ptr, stream);
      ptr++;
    }
  }

}